

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar1;
  char __tmp;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  *pbVar2;
  ulong uVar3;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar4;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar7 = (ulong)spec->width_;
  uVar13 = 4 - (ulong)(f->sign == '\0');
  lVar10 = uVar13 - uVar7;
  if (uVar7 <= uVar13) {
LAB_0015f109:
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
            *)&spec->fill_;
  uVar12 = uVar7 - uVar13;
  if (spec->align_ == ALIGN_CENTER) {
    uVar11 = uVar12 >> 1;
    pbVar2 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar6 = *(ulong *)(this + 8);
    uVar3 = *(ulong *)(this + 0x10);
    bVar4 = this[0x18];
    uVar8 = uVar3;
    uVar9 = uVar11;
    bVar5 = bVar4;
    if (1 < uVar12) {
      do {
        bVar4 = bVar1;
        if (uVar8 < uVar6) {
          *pbVar2 = bVar1;
          pbVar2 = pbVar2 + 1;
          bVar4 = bVar5;
        }
        uVar9 = uVar9 - 1;
        uVar8 = uVar8 + 1;
        bVar5 = bVar4;
      } while (uVar9 != 0);
      uVar3 = uVar3 + uVar11;
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar2;
    *(ulong *)(this + 8) = uVar6;
    *(ulong *)(this + 0x10) = uVar3;
    this[0x18] = bVar4;
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar2 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar6 = *(ulong *)(this + 8);
    uVar3 = *(ulong *)(this + 0x10);
    bVar4 = this[0x18];
    if (uVar12 - uVar11 != 0) {
      lVar10 = (uVar13 + uVar11) - uVar7;
      uVar7 = uVar3;
      bVar5 = bVar4;
      do {
        bVar4 = bVar1;
        if (uVar7 < uVar6) {
          *pbVar2 = bVar1;
          pbVar2 = pbVar2 + 1;
          bVar4 = bVar5;
        }
        uVar7 = uVar7 + 1;
        lVar10 = lVar10 + 1;
        bVar5 = bVar4;
      } while (lVar10 != 0);
      uVar3 = uVar3 + (uVar12 - uVar11);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar2;
    *(ulong *)(this + 8) = uVar6;
    *(ulong *)(this + 0x10) = uVar3;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pbVar2 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar6 = *(ulong *)(this + 8);
      uVar3 = *(ulong *)(this + 0x10);
      lVar10 = uVar13 - uVar7;
      uVar7 = uVar3;
      bVar4 = this[0x18];
      do {
        bVar5 = bVar1;
        if (uVar7 < uVar6) {
          *pbVar2 = bVar1;
          pbVar2 = pbVar2 + 1;
          bVar5 = bVar4;
        }
        uVar7 = uVar7 + 1;
        lVar10 = lVar10 + 1;
        bVar4 = bVar5;
      } while (lVar10 != 0);
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar2;
      *(ulong *)(this + 8) = uVar6;
      *(ulong *)(this + 0x10) = uVar3 + uVar12;
      this[0x18] = bVar5;
      goto LAB_0015f109;
    }
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar2 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar7 = *(ulong *)(this + 8);
    uVar13 = *(ulong *)(this + 0x10);
    uVar6 = uVar13;
    bVar5 = this[0x18];
    do {
      bVar4 = bVar1;
      if (uVar6 < uVar7) {
        *pbVar2 = bVar1;
        pbVar2 = pbVar2 + 1;
        bVar4 = bVar5;
      }
      uVar6 = uVar6 + 1;
      lVar10 = lVar10 + 1;
      bVar5 = bVar4;
    } while (lVar10 != 0);
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar2;
    *(ulong *)(this + 8) = uVar7;
    *(ulong *)(this + 0x10) = uVar13 + uVar12;
  }
  this[0x18] = bVar4;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }